

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

Boolean Q_GetSymmetry(QMatrix *Q)

{
  LASErrIdType LVar1;
  Boolean local_14;
  Boolean Symmetry;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_14 = Q->Symmetry;
  }
  else {
    local_14 = False;
  }
  return local_14;
}

Assistant:

Boolean Q_GetSymmetry(QMatrix *Q)
/* returns True if Q is symmetric otherwise False */
{
    Boolean Symmetry;

    if (LASResult() == LASOK) {
        Symmetry = Q->Symmetry;
    } else {
        Symmetry = (Boolean)0;
    }
    return(Symmetry);
}